

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O1

ON__UINT32 __thiscall ON_Buffer::CRC32(ON_Buffer *this,ON__UINT32 current_remainder)

{
  ulong uVar1;
  ON_BUFFER_SEGMENT *pOVar2;
  ON_BUFFER_SEGMENT *pOVar3;
  char *pcVar4;
  size_t count;
  int iVar5;
  ON_BUFFER_SEGMENT *pOVar6;
  ulong uVar7;
  
  if (this->m_first_segment != (ON_BUFFER_SEGMENT *)0x0) {
    uVar7 = 0;
    pOVar2 = this->m_first_segment;
    pOVar6 = (ON_BUFFER_SEGMENT *)0x0;
    do {
      pOVar3 = pOVar2;
      uVar1 = pOVar3->m_segment_position0;
      if (pOVar3->m_segment_position1 < uVar1) {
        iVar5 = 0x366;
        pcVar4 = "corrupt buffer - segment\'s position values are invalid.";
LAB_0045fe16:
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                   ,iVar5,"",pcVar4);
      }
      else {
        if (pOVar6 == (ON_BUFFER_SEGMENT *)0x0) {
          if (uVar1 != 0) {
            iVar5 = 0x373;
            pcVar4 = "corrupt buffer - first segment has non-zero value for position0.";
            goto LAB_0045fd99;
          }
        }
        else if (pOVar6->m_segment_position1 != uVar1) {
          iVar5 = 0x37e;
          pcVar4 = "corrupt buffer - previous segment\'s position1 !- segment\'s position0.";
LAB_0045fd99:
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                     ,iVar5,"",pcVar4);
        }
        count = pOVar3->m_segment_position1 - pOVar3->m_segment_position0;
        if (count == 0) {
          iVar5 = 0x387;
          pcVar4 = "corrupt buffer - empty segment buffer.";
          goto LAB_0045fe16;
        }
        if (this->m_buffer_size < uVar7 + count) {
          if ((pOVar3 != this->m_last_segment) ||
             (pOVar3->m_next_segment != (ON_BUFFER_SEGMENT *)0x0)) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                       ,0x391,"","corrupt buffer - segments contain more bytes than m_buffer_size.")
            ;
          }
          count = this->m_buffer_size - uVar7;
        }
        current_remainder = ON_CRC32(current_remainder,count,pOVar3->m_segment_buffer);
        uVar7 = uVar7 + count;
        if (this->m_buffer_size <= uVar7) {
          if (((pOVar3 == this->m_last_segment) && (uVar7 <= this->m_buffer_size)) &&
             (pOVar3->m_next_segment == (ON_BUFFER_SEGMENT *)0x0)) {
            return current_remainder;
          }
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                     ,0x39e,"","corrupt buffer - list of segments is too long.");
          return current_remainder;
        }
      }
      pOVar2 = pOVar3->m_next_segment;
      pOVar6 = pOVar3;
    } while (pOVar3->m_next_segment != (ON_BUFFER_SEGMENT *)0x0);
  }
  return current_remainder;
}

Assistant:

ON__UINT32 ON_Buffer::CRC32( ON__UINT32 current_remainder ) const
{
  ON__UINT64 size, seg_size;
  const struct ON_BUFFER_SEGMENT* prev_seg;
  const struct ON_BUFFER_SEGMENT* seg;
  const struct ON_BUFFER_SEGMENT* seg0 = 0;

  size = 0;
  for ( seg = m_first_segment; 0 != seg; seg = seg->m_next_segment )
  {
    // prev_seg is set this way so that the error handling
    // code can use continue statements for non-fatal errors.
    prev_seg = seg0;
    seg0 = seg;

    if ( seg->m_segment_position0 > seg->m_segment_position1 )
    {
      // This is really bad!  If you can determine how the corruption occurs,
      // please make a bug report and tell Dale Lear as soon as possible.
      ON_ERROR("corrupt buffer - segment's position values are invalid.");
      continue;
    }

    if ( 0 == prev_seg )
    {
      if ( 0 != seg->m_segment_position0 )
      {
        // The first segment should have seg->m_segment_position0 = 0.
        // We'll keep going after the call to ON_ERROR.
        //
        // If you can determine how the corruption occurred, please
        // make a bug report and assign it to Dale Lear.
        ON_ERROR("corrupt buffer - first segment has non-zero value for position0.");
      }
    }
    else if ( prev_seg->m_segment_position1 != seg->m_segment_position0 )
    {
      // Every segment after the first should have 
      // seg->m_segment_position0 = previous_segment->m_segment_position1.
      // We'll keep going after the call to ON_ERROR.
      //
      // If you can determine how the corruption occurred, please
      // make a bug report and assign it to Dale Lear.
      ON_ERROR("corrupt buffer - previous segment's position1 !- segment's position0.");
    }

    seg_size = seg->m_segment_position1 - seg->m_segment_position0;

    if ( 0 == seg_size )
    {
      // If you can determine how the corruption occurred, please
      // make a bug report and assign it to Dale Lear.
      ON_ERROR("corrupt buffer - empty segment buffer.");
      continue;
    }
    
    if ( seg_size + size > m_buffer_size )
    {
      if ( seg != m_last_segment || seg->m_next_segment )
      {
        // If you can determine how the corruption occurred, please
        // make a bug report and assign it to Dale Lear.
        ON_ERROR("corrupt buffer - segments contain more bytes than m_buffer_size.");
      }
      seg_size = m_buffer_size - size;
    }

    current_remainder = ON_CRC32(current_remainder,(size_t)seg_size,seg->m_segment_buffer);
    size += seg_size;
    if ( size >= m_buffer_size )
    {
      if ( seg != m_last_segment || 0 != seg->m_next_segment || size > m_buffer_size )
      {
        // If you can determine how the corruption occurred, please
        // make a bug report and assign it to Dale Lear.
        ON_ERROR("corrupt buffer - list of segments is too long.");
      }
      break;
    }
  }

  return current_remainder;
}